

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::_InternalSerialize
          (TreeEnsembleParameters_TreeNode *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  double dVar1;
  void *data;
  bool bVar2;
  uint8_t uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  Type *this_00;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int index;
  size_t __n;
  
  uVar6 = this->treeid_;
  puVar4 = target;
  if (uVar6 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar6 = this->treeid_;
    }
    *target = '\b';
    target[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      target[2] = (uint8_t)(uVar6 >> 7);
      puVar4 = target + 3;
      if (0x3fff < uVar6) {
        uVar10 = (ulong)target[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar4[-1] = (byte)uVar10 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar7;
          puVar4 = puVar4 + 1;
          uVar10 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  uVar6 = this->nodeid_;
  if (uVar6 != 0) {
    puVar5 = puVar4;
    if (stream->end_ <= puVar4) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
      uVar6 = this->nodeid_;
    }
    *puVar5 = '\x10';
    puVar5[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar4 = puVar5 + 2;
    }
    else {
      puVar5[1] = (byte)uVar6 | 0x80;
      puVar5[2] = (uint8_t)(uVar6 >> 7);
      puVar4 = puVar5 + 3;
      if (0x3fff < uVar6) {
        uVar10 = (ulong)puVar5[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar4[-1] = (byte)uVar10 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar7;
          puVar4 = puVar4 + 1;
          uVar10 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  uVar8 = this->nodebehavior_;
  puVar5 = puVar4;
  if (uVar8 != 0) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
      uVar8 = this->nodebehavior_;
    }
    *puVar4 = '\x18';
    puVar4[1] = (byte)uVar8;
    if (uVar8 < 0x80) {
      puVar5 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar8 | 0x80;
      puVar4[2] = (uint8_t)((ulong)(long)(int)uVar8 >> 7);
      puVar5 = puVar4 + 3;
      if (0x3fff < uVar8) {
        uVar10 = (ulong)puVar4[2];
        uVar6 = (ulong)(long)(int)uVar8 >> 7;
        do {
          puVar5[-1] = (byte)uVar10 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar5 = (uint8_t)uVar7;
          puVar5 = puVar5 + 1;
          uVar10 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  uVar6 = this->branchfeatureindex_;
  if (uVar6 != 0) {
    puVar4 = puVar5;
    if (stream->end_ <= puVar5) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
      uVar6 = this->branchfeatureindex_;
    }
    *puVar4 = 'P';
    puVar4[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar5 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar6 | 0x80;
      puVar4[2] = (uint8_t)(uVar6 >> 7);
      puVar5 = puVar4 + 3;
      if (0x3fff < uVar6) {
        uVar10 = (ulong)puVar4[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar5[-1] = (byte)uVar10 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar5 = (uint8_t)uVar7;
          puVar5 = puVar5 + 1;
          uVar10 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  dVar1 = this->branchfeaturevalue_;
  if (dVar1 != 0.0) {
    if (stream->end_ <= puVar5) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
      dVar1 = this->branchfeaturevalue_;
    }
    *puVar5 = 'Y';
    *(double *)(puVar5 + 1) = dVar1;
    puVar5 = puVar5 + 9;
  }
  uVar6 = this->truechildnodeid_;
  puVar4 = puVar5;
  if (uVar6 != 0) {
    if (stream->end_ <= puVar5) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
      uVar6 = this->truechildnodeid_;
    }
    *puVar5 = '`';
    puVar5[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar4 = puVar5 + 2;
    }
    else {
      puVar5[1] = (byte)uVar6 | 0x80;
      puVar5[2] = (uint8_t)(uVar6 >> 7);
      puVar4 = puVar5 + 3;
      if (0x3fff < uVar6) {
        uVar10 = (ulong)puVar5[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar4[-1] = (byte)uVar10 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar7;
          puVar4 = puVar4 + 1;
          uVar10 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  uVar6 = this->falsechildnodeid_;
  puVar5 = puVar4;
  if (uVar6 != 0) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
      uVar6 = this->falsechildnodeid_;
    }
    *puVar4 = 'h';
    puVar4[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar5 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar6 | 0x80;
      puVar4[2] = (uint8_t)(uVar6 >> 7);
      puVar5 = puVar4 + 3;
      if (0x3fff < uVar6) {
        uVar10 = (ulong)puVar4[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar5[-1] = (byte)uVar10 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar5 = (uint8_t)uVar7;
          puVar5 = puVar5 + 1;
          uVar10 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  if (this->missingvaluetrackstruechild_ == true) {
    uVar3 = '\x01';
    if (stream->end_ <= puVar5) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
      uVar3 = this->missingvaluetrackstruechild_;
    }
    *puVar5 = 'p';
    puVar5[1] = uVar3;
    puVar5 = puVar5 + 2;
  }
  iVar9 = (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar9 != 0) {
    index = 0;
    do {
      if (stream->end_ <= puVar5) {
        puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                          (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,index);
      puVar5[0] = 0xa2;
      puVar5[1] = '\x01';
      uVar8 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar5[2] = (uint8_t)uVar8;
      if (uVar8 < 0x80) {
        puVar5 = puVar5 + 3;
      }
      else {
        puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar8,puVar5 + 2);
      }
      puVar5 = TreeEnsembleParameters_TreeNode_EvaluationInfo::_InternalSerialize
                         (this_00,puVar5,stream);
      index = index + 1;
    } while (iVar9 != index);
  }
  dVar1 = this->relativehitrate_;
  if (dVar1 != 0.0) {
    if (stream->end_ <= puVar5) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar5);
      dVar1 = this->relativehitrate_;
    }
    puVar5[0] = 0xf1;
    puVar5[1] = '\x01';
    *(double *)(puVar5 + 2) = dVar1;
    puVar5 = puVar5 + 10;
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    data = *(void **)(uVar6 + 8);
    iVar9 = (int)*(undefined8 *)(uVar6 + 0x10);
    __n = (size_t)iVar9;
    if ((long)stream->end_ - (long)puVar5 < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,iVar9,puVar5)
      ;
      return puVar4;
    }
    memcpy(puVar5,data,__n);
    puVar5 = puVar5 + __n;
  }
  return puVar5;
}

Assistant:

uint8_t* TreeEnsembleParameters_TreeNode::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 treeId = 1;
  if (this->_internal_treeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_treeid(), target);
  }

  // uint64 nodeId = 2;
  if (this->_internal_nodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_nodeid(), target);
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->_internal_nodebehavior() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_nodebehavior(), target);
  }

  // uint64 branchFeatureIndex = 10;
  if (this->_internal_branchfeatureindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(10, this->_internal_branchfeatureindex(), target);
  }

  // double branchFeatureValue = 11;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_branchfeaturevalue = this->_internal_branchfeaturevalue();
  uint64_t raw_branchfeaturevalue;
  memcpy(&raw_branchfeaturevalue, &tmp_branchfeaturevalue, sizeof(tmp_branchfeaturevalue));
  if (raw_branchfeaturevalue != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(11, this->_internal_branchfeaturevalue(), target);
  }

  // uint64 trueChildNodeId = 12;
  if (this->_internal_truechildnodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(12, this->_internal_truechildnodeid(), target);
  }

  // uint64 falseChildNodeId = 13;
  if (this->_internal_falsechildnodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(13, this->_internal_falsechildnodeid(), target);
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->_internal_missingvaluetrackstruechild() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_missingvaluetrackstruechild(), target);
  }

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_evaluationinfo_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(20, this->_internal_evaluationinfo(i), target, stream);
  }

  // double relativeHitRate = 30;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_relativehitrate = this->_internal_relativehitrate();
  uint64_t raw_relativehitrate;
  memcpy(&raw_relativehitrate, &tmp_relativehitrate, sizeof(tmp_relativehitrate));
  if (raw_relativehitrate != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(30, this->_internal_relativehitrate(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return target;
}